

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

Mat3x3d * __thiscall OpenMD::Thermo::getBoundingBox(Mat3x3d *__return_storage_ptr__,Thermo *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  Snapshot *this_00;
  RigidBody *this_01;
  pointer ppAVar4;
  Atom *pAVar5;
  Molecule *pMVar6;
  pointer ppAVar7;
  int i_1;
  long lVar8;
  pointer ppRVar9;
  int iVar10;
  long lVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  Vector3d bMin;
  Vector3d bMax;
  MoleculeIterator i;
  Mat3x3d bBox;
  double local_e8 [4];
  double local_c8 [4];
  Mat3x3d *local_a8;
  MoleculeIterator local_a0;
  double local_98 [4];
  Mat3x3d local_78;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasBoundingBox == false) {
    iVar10 = 0;
    local_a0._M_node = (_Base_ptr)0x0;
    local_c8[2] = 0.0;
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    local_e8[2] = 0.0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_a8 = __return_storage_ptr__;
    pMVar6 = SimInfo::beginMolecule(this->info_,&local_a0);
    if (pMVar6 != (Molecule *)0x0) {
      do {
        ppRVar9 = (pMVar6->rigidBodies_).
                  super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppRVar9 !=
            (pMVar6->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          this_01 = *ppRVar9;
          while (this_01 != (RigidBody *)0x0) {
            ppRVar9 = ppRVar9 + 1;
            RigidBody::updateAtoms(this_01);
            if (ppRVar9 ==
                (pMVar6->rigidBodies_).
                super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) break;
            this_01 = *ppRVar9;
          }
        }
        ppAVar4 = (pMVar6->atoms_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppAVar7 = (pMVar6->atoms_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            (ppAVar7 != ppAVar4 && (pAVar5 = *ppAVar7, pAVar5 != (Atom *)0x0));
            ppAVar7 = ppAVar7 + 1) {
          lVar11 = (long)(pAVar5->super_StuntDouble).localIndex_;
          lVar8 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (pAVar5->super_StuntDouble).storage_);
          local_98[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar11 * 0x18);
          pdVar1 = (double *)(lVar8 + lVar11 * 0x18);
          local_98[0] = *pdVar1;
          local_98[1] = pdVar1[1];
          if (iVar10 == 0) {
            pdVar1 = (double *)(lVar8 + lVar11 * 0x18);
            local_c8[2] = pdVar1[2];
            local_c8[0] = *pdVar1;
            local_c8[1] = pdVar1[1];
            local_e8[0] = *pdVar1;
            local_e8[1] = pdVar1[1];
            local_e8[2] = pdVar1[2];
          }
          else {
            lVar8 = 0;
            do {
              dVar2 = local_98[lVar8];
              uVar12 = SUB84(dVar2,0);
              uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
              dVar14 = dVar2;
              if (dVar2 <= local_c8[lVar8]) {
                dVar14 = local_c8[lVar8];
              }
              dVar3 = local_e8[lVar8];
              if (dVar3 <= dVar2) {
                uVar12 = SUB84(dVar3,0);
                uVar13 = (undefined4)((ulong)dVar3 >> 0x20);
              }
              local_c8[lVar8] = dVar14;
              local_e8[lVar8] = (double)CONCAT44(uVar13,uVar12);
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
          }
          iVar10 = iVar10 + 1;
        }
        pMVar6 = SimInfo::nextMolecule(this->info_,&local_a0);
      } while (pMVar6 != (Molecule *)0x0);
    }
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    lVar8 = 0;
    do {
      *(double *)
       ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar8 * 4) = *(double *)((long)local_c8 + lVar8) - *(double *)((long)local_e8 + lVar8);
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x18);
    Snapshot::setBoundingBox(this_00,&local_78);
    __return_storage_ptr__ = local_a8;
  }
  Snapshot::getBoundingBox(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Thermo::getBoundingBox() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!(snap->hasBoundingBox)) {
      SimInfo::MoleculeIterator i;
      Molecule::RigidBodyIterator ri;
      Molecule::AtomIterator ai;
      Molecule* mol;
      RigidBody* rb;
      Atom* atom;
      Vector3d pos, bMax, bMin;
      int index = 0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        // change the positions of atoms which belong to the rigidbodies
        for (rb = mol->beginRigidBody(ri); rb != NULL;
             rb = mol->nextRigidBody(ri)) {
          rb->updateAtoms();
        }

        for (atom = mol->beginAtom(ai); atom != NULL;
             atom = mol->nextAtom(ai)) {
          pos = atom->getPos();

          if (index == 0) {
            bMax = pos;
            bMin = pos;
          } else {
            for (int i = 0; i < 3; i++) {
              bMax[i] = max(bMax[i], pos[i]);
              bMin[i] = min(bMin[i], pos[i]);
            }
          }
          index++;
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &bMax[0], 3, MPI_REALTYPE, MPI_MAX,
                    MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, &bMin[0], 3, MPI_REALTYPE, MPI_MIN,
                    MPI_COMM_WORLD);
#endif
      Mat3x3d bBox = Mat3x3d(0.0);
      for (int i = 0; i < 3; i++) {
        bBox(i, i) = bMax[i] - bMin[i];
      }
      snap->setBoundingBox(bBox);
    }

    return snap->getBoundingBox();
  }